

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O0

int __thiscall iDynTree::SimpleLeggedOdometry::init(SimpleLeggedOdometry *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  LinkIndex LVar2;
  Transform *pTVar3;
  Transform floatingBase_H_fixedLink;
  Transform linkAttachedToWorld_H_floatingBase;
  Transform initalReferenceFrame_H_linkAttachedToWorld;
  Transform world_H_initialReferenceFrame;
  LinkIndex linkAttachedToWorldIndex;
  Transform local_330 [96];
  Transform local_2d0 [96];
  Transform local_270 [96];
  Transform local_210 [192];
  undefined1 local_150 [192];
  Transform local_90 [96];
  long local_30;
  EVP_PKEY_CTX *local_18;
  SimpleLeggedOdometry *local_10;
  undefined1 local_1;
  
  local_18 = ctx;
  local_10 = this;
  if ((this->m_isModelValid & 1U) == 0) {
    this = (SimpleLeggedOdometry *)
           iDynTree::reportError("SimpleLeggedOdometry","init","Model not initialised.");
    local_1 = 0;
  }
  else {
    uVar1 = iDynTree::Model::isValidFrameIndex((long)this);
    if (((uVar1 & 1) == 0) ||
       (uVar1 = iDynTree::Model::isValidFrameIndex((long)this), (uVar1 & 1) == 0)) {
      this = (SimpleLeggedOdometry *)
             iDynTree::reportError("SimpleLeggedOdometry","init","invalid frame passed");
      local_1 = 0;
    }
    else if ((this->m_kinematicsUpdated & 1U) == 0) {
      this = (SimpleLeggedOdometry *)
             iDynTree::reportError("SimpleLeggedOdometry","init","updateKinematics never called");
      local_1 = 0;
    }
    else {
      LVar2 = iDynTree::Model::getFrameLink((long)this);
      this->m_fixedLinkIndex = LVar2;
      local_30 = iDynTree::Model::getFrameLink((long)this);
      iDynTree::Transform::inverse();
      iDynTree::Model::getFrameTransform((long)local_150);
      iDynTree::Transform::inverse();
      iDynTree::LinkPositions::operator()(&this->m_base_H_link,local_30);
      iDynTree::Transform::inverse();
      pTVar3 = (Transform *)
               iDynTree::LinkPositions::operator()(&this->m_base_H_link,this->m_fixedLinkIndex);
      iDynTree::Transform::Transform(local_210,pTVar3);
      iDynTree::Transform::operator*(local_330,local_90);
      iDynTree::Transform::operator*(local_2d0,local_330);
      iDynTree::Transform::operator*(local_270,local_2d0);
      iDynTree::Transform::operator=(&this->m_world_H_fixedLink,local_270);
      this->m_isOdometryInitialized = true;
      local_1 = 1;
    }
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool SimpleLeggedOdometry::init(const FrameIndex initialFixedFrameIndex,
                                const FrameIndex initalReferenceFrameIndexForWorld,
                                const Transform initialReferenceFrame_H_world)
{
    if( !m_isModelValid )
    {
         reportError("SimpleLeggedOdometry",
                     "init",
                     "Model not initialised.");
         return false;
    }

    if( !m_model.isValidFrameIndex(initialFixedFrameIndex) ||
        !m_model.isValidFrameIndex(initalReferenceFrameIndexForWorld) )
    {
        reportError("SimpleLeggedOdometry",
                    "init","invalid frame passed");
        return false;
    }

    if( ! m_kinematicsUpdated )
    {
        reportError("SimpleLeggedOdometry",
                    "init","updateKinematics never called");
        return false;
    }

    m_fixedLinkIndex = m_model.getFrameLink(initialFixedFrameIndex);
    LinkIndex linkAttachedToWorldIndex = m_model.getFrameLink(initalReferenceFrameIndexForWorld);

    Transform world_H_initialReferenceFrame = initialReferenceFrame_H_world.inverse();
    Transform initalReferenceFrame_H_linkAttachedToWorld =  m_model.getFrameTransform(initalReferenceFrameIndexForWorld).inverse();
    Transform linkAttachedToWorld_H_floatingBase = m_base_H_link(linkAttachedToWorldIndex).inverse();
    Transform floatingBase_H_fixedLink           = m_base_H_link(m_fixedLinkIndex);

    m_world_H_fixedLink = world_H_initialReferenceFrame*initalReferenceFrame_H_linkAttachedToWorld*linkAttachedToWorld_H_floatingBase*floatingBase_H_fixedLink;

    m_isOdometryInitialized = true;

    return true;
}